

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::StringMaker<std::vector<bool,_std::allocator<bool>_>_>::convert
                   (String *__return_storage_ptr__,vector<bool,_std::allocator<bool>_> *in)

{
  String *pSVar1;
  vector<bool,_std::allocator<bool>_> *pvVar2;
  ostream *poVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  bool bVar6;
  ostringstream oss;
  anon_union_24_2_13149d16_for_String_2 local_1d8;
  String *local_1b8;
  vector<bool,_std::allocator<bool>_> *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
  p_Var4 = (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((p_Var4 != (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p) ||
     ((in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset != 0)) {
    uVar5 = 0;
    local_1b0 = in;
    do {
      bVar6 = uVar5 == 0x3f;
      uVar5 = uVar5 + 1;
      if (bVar6) {
        uVar5 = 0;
      }
      poVar3 = detail::getTlsOss();
      std::ostream::_M_insert<bool>(SUB81(poVar3,0));
      detail::getTlsOssResult();
      operator<<((ostream *)local_1a8,(String *)&local_1d8.data);
      p_Var4 = p_Var4 + bVar6;
      String::~String((String *)&local_1d8.data);
      pvVar2 = local_1b0;
      if ((p_Var4 != (local_1b0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
         (uVar5 != (local_1b0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
    } while ((p_Var4 != (pvVar2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
            (uVar5 != (pvVar2->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  pSVar1 = local_1b8;
  String::String(local_1b8,local_1d8.data.ptr);
  if (local_1d8.data.ptr != local_1d8.buf + 0x10) {
    operator_delete(local_1d8.data.ptr,local_1d8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pSVar1;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }